

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O3

string_t * __thiscall
cfgfile::
tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::print(string_t *__return_storage_ptr__,
       tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
       *this,int indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  ulong uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar8;
  char cVar9;
  long lVar10;
  undefined8 *puVar11;
  string_t spaces;
  string_t value;
  string_t tmp;
  long *local_c8 [2];
  long local_b8 [2];
  long *local_a8;
  ulong local_a0;
  long local_98 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  string_t local_80;
  long local_60;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *local_58;
  string_t local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar5 = tag_t<cfgfile::string_trait_t>::is_defined(&this->super_tag_t<cfgfile::string_trait_t>);
  if (bVar5) {
    local_60 = (long)indent;
    local_a8 = local_98;
    local_88 = &__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)&local_a8,(char)indent);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a8);
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
    cVar9 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar9);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,
               (ulong)(this->super_tag_t<cfgfile::string_trait_t>).m_name._M_dataplus._M_p);
    std::__cxx11::string::push_back(cVar9);
    pcVar2 = (this->m_value)._M_dataplus._M_p;
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar2,pcVar2 + (this->m_value)._M_string_length);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_a0;
    uVar7 = SUB168(ZEXT816(0xcccccccccccccccd) * auVar4,0);
    lVar8 = (ulong)(0x333333333333333 < (uVar7 >> 4 | uVar7 << 0x3c)) + local_a0 / 0x50;
    if (lVar8 == 0) {
      std::__cxx11::string::push_back(cVar9);
      std::__cxx11::string::push_back(cVar9);
    }
    else {
      local_c8[0] = local_b8;
      local_58 = this;
      std::__cxx11::string::_M_construct
                ((ulong)local_c8,
                 (char)(this->super_tag_t<cfgfile::string_trait_t>).m_name._M_string_length + '\x02'
                );
      paVar1 = &local_80.field_2;
      lVar10 = 0;
      do {
        if (lVar10 != 0) {
          std::__cxx11::string::push_back(cVar9);
          local_80._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct((ulong)&local_80,(char)local_60);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar1) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c8[0]);
        }
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_a8);
        to_cfgfile_format<cfgfile::string_trait_t>(&local_80,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        lVar10 = lVar10 + 1;
      } while (lVar8 != lVar10);
      this = local_58;
      if (local_c8[0] != local_b8) {
        operator_delete(local_c8[0],local_b8[0] + 1);
        this = local_58;
      }
    }
    iVar6 = (*(this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])(this);
    if (*(long *)CONCAT44(extraout_var,iVar6) != ((long *)CONCAT44(extraout_var,iVar6))[1]) {
      std::__cxx11::string::push_back(cVar9);
      iVar6 = (*(this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])(this);
      puVar11 = *(undefined8 **)CONCAT44(extraout_var_00,iVar6);
      puVar3 = (undefined8 *)((long *)CONCAT44(extraout_var_00,iVar6))[1];
      if (puVar11 != puVar3) {
        do {
          (**(code **)(*(long *)*puVar11 + 0x18))(local_c8,(long *)*puVar11,indent + 1);
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c8[0]);
          if (local_c8[0] != local_b8) {
            operator_delete(local_c8[0],local_b8[0] + 1);
          }
          puVar11 = puVar11 + 1;
        } while (puVar11 != puVar3);
      }
      local_c8[0] = local_b8;
      std::__cxx11::string::_M_construct((ulong)local_c8,(char)local_60);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c8[0]);
      if (local_c8[0] != local_b8) {
        operator_delete(local_c8[0],local_b8[0] + 1);
      }
    }
    std::__cxx11::string::push_back(cVar9);
    std::__cxx11::string::push_back(cVar9);
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );

			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );
			result.push_back( const_t< Trait >::c_space );

			typename Trait::string_t value =
				format_t< typename Trait::string_t, Trait >::to_string( m_value );

			const typename Trait::pos_t sections =
				( value.length() / c_max_string_length +
				( value.length() % c_max_string_length > 0 ? 1 : 0 ) );

			if( sections )
			{
				const typename Trait::string_t spaces =
					typename Trait::string_t( this->name().length() + 2,
						const_t< Trait >::c_space );

				for( typename Trait::pos_t i = 0; i < sections; ++i )
				{
					if( i > 0 )
					{
						result.push_back( const_t< Trait >::c_carriage_return );

						result.append( typename Trait::string_t( indent,
							const_t< Trait >::c_tab ) );

						result.append( spaces );
					}

					const typename Trait::string_t tmp =
						to_cfgfile_format< Trait > (
							value.substr( i * c_max_string_length,
								c_max_string_length ) );

					result.append( tmp );
				}
			}
			else
			{
				result.push_back( const_t< Trait >::c_quotes );
				result.push_back( const_t< Trait >::c_quotes );
			}

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}